

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O0

RDL_cycleIterator * RDL_getRCyclesIterator(RDL_data *data)

{
  RDL_cycleIterator *it;
  RDL_data *data_local;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    data_local = (RDL_data *)0x0;
  }
  else {
    data_local = (RDL_data *)
                 RDL_initCycleIterator(RDL_ALL_IT,0,0,0,0,0,data->bccGraphs->nof_bcc - 1,'b',data);
  }
  return (RDL_cycleIterator *)data_local;
}

Assistant:

RDL_cycleIterator* RDL_getRCyclesIterator(const RDL_data *data)
{
  RDL_cycleIterator* it;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    return NULL;
  }

  it = RDL_initCycleIterator(
      RDL_ALL_IT,
      0, 0,
      0, 0,
      0, data->bccGraphs->nof_bcc-1,
      'b', data);

  return it;
}